

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_shufflin_geom(REF_GRID ref_grid)

{
  int iVar1;
  uint uVar2;
  int local_ec;
  REF_GLOB local_e8;
  int local_e0;
  int local_dc;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT descr [6];
  REF_GLOB global;
  REF_INT geom;
  REF_INT item;
  REF_INT degree;
  REF_INT i;
  REF_DBL *b_real;
  REF_DBL *a_real;
  REF_GLOB *b_int;
  REF_GLOB *a_int;
  REF_INT *a_next;
  REF_INT node;
  REF_INT part;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT *b_size;
  REF_INT *a_size;
  REF_ADJ ref_adj;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  ref_geom = (REF_GEOM)ref_grid->node;
  ref_adj = (REF_ADJ)ref_grid->geom;
  a_size = &((REF_GEOM)ref_adj)->ref_adj->nnode;
  if (ref_node->n < 2) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    ref_mpi = (REF_MPI)ref_grid;
    if (ref_node->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x64b,"ref_migrate_shufflin_geom","malloc a_size of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      b_size = (REF_INT *)malloc((long)ref_node->n << 2);
      if (b_size == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x64b,"ref_migrate_shufflin_geom","malloc a_size of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_node->n;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          b_size[ref_private_macro_code_rss] = 0;
        }
        if (ref_node->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x64c,"ref_migrate_shufflin_geom","malloc b_size of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          _b_total = (REF_INT *)malloc((long)ref_node->n << 2);
          if (_b_total == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x64c,"ref_migrate_shufflin_geom","malloc b_size of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_node->n;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              _b_total[ref_private_macro_code_rss_1] = 0;
            }
            for (a_next._0_4_ = 0; (int)a_next < ref_geom->max; a_next._0_4_ = (int)a_next + 1) {
              if ((((-1 < (int)a_next) && ((int)a_next < ref_geom->max)) &&
                  (-1 < *(long *)(ref_geom->descr + (long)(int)a_next * 2))) &&
                 (ref_node->max !=
                  *(int *)((long)ref_geom->initial_cell_height + (long)(int)a_next * 4))) {
                uVar2 = ref_adj_degree((REF_ADJ)a_size,(int)a_next,&geom);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x650,"ref_migrate_shufflin_geom",(ulong)uVar2,"adj deg");
                  return uVar2;
                }
                iVar1 = *(int *)((long)ref_geom->initial_cell_height + (long)(int)a_next * 4);
                b_size[iVar1] = geom + b_size[iVar1];
              }
            }
            uVar2 = ref_mpi_alltoall((REF_MPI)ref_node,b_size,_b_total,1);
            if (uVar2 == 0) {
              part = 0;
              for (a_next._4_4_ = 0; a_next._4_4_ < ref_node->n; a_next._4_4_ = a_next._4_4_ + 1) {
                part = b_size[a_next._4_4_] + part;
              }
              if (part * 6 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x65a,"ref_migrate_shufflin_geom","malloc a_int of REF_GLOB negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                b_int = (REF_GLOB *)malloc((long)(part * 6) << 3);
                if (b_int == (REF_GLOB *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x65a,"ref_migrate_shufflin_geom","malloc a_int of REF_GLOB NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else if (part * 2 < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x65b,"ref_migrate_shufflin_geom","malloc a_real of REF_DBL negative");
                  ref_grid_local._4_4_ = 1;
                }
                else {
                  b_real = (REF_DBL *)malloc((long)(part << 1) << 3);
                  if (b_real == (REF_DBL *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x65b,"ref_migrate_shufflin_geom","malloc a_real of REF_DBL NULL");
                    ref_grid_local._4_4_ = 2;
                  }
                  else {
                    node = 0;
                    for (a_next._4_4_ = 0; a_next._4_4_ < ref_node->n;
                        a_next._4_4_ = a_next._4_4_ + 1) {
                      node = _b_total[a_next._4_4_] + node;
                    }
                    if (node * 6 < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x65f,"ref_migrate_shufflin_geom","malloc b_int of REF_GLOB negative")
                      ;
                      ref_grid_local._4_4_ = 1;
                    }
                    else {
                      a_real = (REF_DBL *)malloc((long)(node * 6) << 3);
                      if (a_real == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x65f,"ref_migrate_shufflin_geom","malloc b_int of REF_GLOB NULL");
                        ref_grid_local._4_4_ = 2;
                      }
                      else if (node * 2 < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x660,"ref_migrate_shufflin_geom",
                               "malloc b_real of REF_DBL negative");
                        ref_grid_local._4_4_ = 1;
                      }
                      else {
                        _degree = malloc((long)(node << 1) << 3);
                        if (_degree == (void *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x660,"ref_migrate_shufflin_geom","malloc b_real of REF_DBL NULL")
                          ;
                          ref_grid_local._4_4_ = 2;
                        }
                        else if (ref_node->n < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x662,"ref_migrate_shufflin_geom",
                                 "malloc a_next of REF_INT negative");
                          ref_grid_local._4_4_ = 1;
                        }
                        else {
                          a_int = (REF_GLOB *)malloc((long)ref_node->n << 2);
                          if (a_int == (REF_GLOB *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x662,"ref_migrate_shufflin_geom",
                                   "malloc a_next of REF_INT NULL");
                            ref_grid_local._4_4_ = 2;
                          }
                          else {
                            *(undefined4 *)a_int = 0;
                            for (a_next._4_4_ = 1; a_next._4_4_ < ref_node->n;
                                a_next._4_4_ = a_next._4_4_ + 1) {
                              *(int *)((long)a_int + (long)a_next._4_4_ * 4) =
                                   *(int *)((long)a_int + (long)(a_next._4_4_ + -1) * 4) +
                                   b_size[a_next._4_4_ + -1];
                            }
                            for (a_next._0_4_ = 0; (int)a_next < ref_geom->max;
                                a_next._0_4_ = (int)a_next + 1) {
                              if (((-1 < (int)a_next) && ((int)a_next < ref_geom->max)) &&
                                 ((-1 < *(long *)(ref_geom->descr + (long)(int)a_next * 2) &&
                                  (ref_node->max !=
                                   *(int *)((long)ref_geom->initial_cell_height +
                                           (long)(int)a_next * 4))))) {
                                if (((int)a_next < 0) || (*a_size <= (int)a_next)) {
                                  local_dc = -1;
                                }
                                else {
                                  local_dc = *(int *)(*(long *)(a_size + 2) + (long)(int)a_next * 4)
                                  ;
                                }
                                global._4_4_ = local_dc;
                                if (local_dc == -1) {
                                  local_e0 = -1;
                                }
                                else {
                                  local_e0 = *(int *)(*(long *)(a_size + 4) + 4 + (long)local_dc * 8
                                                     );
                                }
                                global._0_4_ = local_e0;
                                while (global._4_4_ != -1) {
                                  a_next._4_4_ = *(int *)((long)ref_geom->initial_cell_height +
                                                         (long)(int)a_next * 4);
                                  for (item = 0; item < 6; item = item + 1) {
                                    b_int[item + *(int *)((long)a_int + (long)a_next._4_4_ * 4) * 6]
                                         = (long)(&ref_adj->item->next)[item + (int)global * 6];
                                  }
                                  if ((((&ref_adj->item->next)[(int)global * 6 + 5] < 0) ||
                                      (ref_geom->max <= (&ref_adj->item->next)[(int)global * 6 + 5])
                                      ) || (*(long *)(ref_geom->descr +
                                                     (long)(&ref_adj->item->next)
                                                           [(int)global * 6 + 5] * 2) < 0)) {
                                    local_e8 = -1;
                                  }
                                  else {
                                    local_e8 = *(REF_GLOB *)
                                                (ref_geom->descr +
                                                (long)(&ref_adj->item->next)[(int)global * 6 + 5] *
                                                2);
                                  }
                                  b_int[*(int *)((long)a_int + (long)a_next._4_4_ * 4) * 6 + 5] =
                                       local_e8;
                                  b_real[*(int *)((long)a_int + (long)a_next._4_4_ * 4) << 1] =
                                       *(REF_DBL *)
                                        (*(long *)&ref_adj->blank + (long)((int)global << 1) * 8);
                                  b_real[*(int *)((long)a_int + (long)a_next._4_4_ * 4) * 2 + 1] =
                                       *(REF_DBL *)
                                        (*(long *)&ref_adj->blank + (long)((int)global * 2 + 1) * 8)
                                  ;
                                  *(int *)((long)a_int + (long)a_next._4_4_ * 4) =
                                       *(int *)((long)a_int + (long)a_next._4_4_ * 4) + 1;
                                  global._4_4_ = *(int *)(*(long *)(a_size + 4) +
                                                         (long)global._4_4_ * 8);
                                  if (global._4_4_ == -1) {
                                    local_ec = -1;
                                  }
                                  else {
                                    local_ec = *(int *)(*(long *)(a_size + 4) + 4 +
                                                       (long)global._4_4_ * 8);
                                  }
                                  global._0_4_ = local_ec;
                                }
                              }
                            }
                            uVar2 = ref_mpi_alltoallv((REF_MPI)ref_node,b_int,b_size,a_real,_b_total
                                                      ,6,2);
                            if (uVar2 == 0) {
                              uVar2 = ref_mpi_alltoallv((REF_MPI)ref_node,b_real,b_size,_degree,
                                                        _b_total,2,3);
                              if (uVar2 == 0) {
                                for (global._0_4_ = 0; (int)global < node;
                                    global._0_4_ = (int)global + 1) {
                                  for (item = 0; item < 6; item = item + 1) {
                                    (&ref_malloc_init_i_1)[item] =
                                         SUB84(a_real[item + (int)global * 6],0);
                                  }
                                  uVar2 = ref_node_local((REF_NODE)ref_geom,
                                                         (REF_GLOB)a_real[(int)global * 6 + 5],
                                                         (REF_INT *)&a_next);
                                  if (uVar2 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                           ,0x685,"ref_migrate_shufflin_geom",(ulong)uVar2,"g2l");
                                    return uVar2;
                                  }
                                  descr[3] = (int)a_next;
                                  uVar2 = ref_geom_add_with_descr
                                                    ((REF_GEOM)ref_adj,&ref_malloc_init_i_1,
                                                     (REF_DBL *)
                                                     ((long)_degree + (long)((int)global << 1) * 8))
                                  ;
                                  if (uVar2 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                           ,0x688,"ref_migrate_shufflin_geom",(ulong)uVar2,
                                           "geom add");
                                    return uVar2;
                                  }
                                }
                                free(a_int);
                                free(_degree);
                                free(a_real);
                                free(b_real);
                                free(b_int);
                                free(_b_total);
                                free(b_size);
                                ref_grid_local._4_4_ = 0;
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                       ,0x67e,"ref_migrate_shufflin_geom",(ulong)uVar2,
                                       "alltoallv geom real");
                                ref_grid_local._4_4_ = uVar2;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                     ,0x67b,"ref_migrate_shufflin_geom",(ulong)uVar2,
                                     "alltoallv geom int");
                              ref_grid_local._4_4_ = uVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x656,"ref_migrate_shufflin_geom",(ulong)uVar2,"alltoall sizes");
              ref_grid_local._4_4_ = uVar2;
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_shufflin_geom(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT part, node;
  REF_INT *a_next;
  REF_GLOB *a_int, *b_int;
  REF_DBL *a_real, *b_real;
  REF_INT i, degree, item, geom;
  REF_GLOB global;
  REF_INT descr[REF_GEOM_DESCR_SIZE];

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      RSS(ref_adj_degree(ref_adj, node, &degree), "adj deg");
      a_size[ref_node_part(ref_node, node)] += degree;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_int, REF_GEOM_DESCR_SIZE * a_total, REF_GLOB);
  ref_malloc(a_real, 2 * a_total, REF_DBL);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_int, REF_GEOM_DESCR_SIZE * b_total, REF_GLOB);
  ref_malloc(b_real, 2 * b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
        part = ref_node_part(ref_node, node);
        each_ref_descr(ref_geom, i) {
          a_int[i + REF_GEOM_DESCR_SIZE * a_next[part]] =
              (REF_GLOB)ref_geom_descr(ref_geom, i, geom);
        }
        a_int[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * a_next[part]] =
            ref_node_global(ref_node, ref_geom_node(ref_geom, geom));
        a_real[0 + 2 * a_next[part]] = ref_geom_param(ref_geom, 0, geom);
        a_real[1 + 2 * a_next[part]] = ref_geom_param(ref_geom, 1, geom);
        a_next[part]++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_int, a_size, b_int, b_size,
                        REF_GEOM_DESCR_SIZE, REF_GLOB_TYPE),
      "alltoallv geom int");
  RSS(ref_mpi_alltoallv(ref_mpi, a_real, a_size, b_real, b_size, 2,
                        REF_DBL_TYPE),
      "alltoallv geom real");

  for (geom = 0; geom < b_total; geom++) {
    each_ref_descr(ref_geom, i) {
      descr[i] = (REF_INT)b_int[i + REF_GEOM_DESCR_SIZE * geom];
    }
    global = b_int[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * geom];
    RSS(ref_node_local(ref_node, global, &node), "g2l");
    descr[REF_GEOM_DESCR_NODE] = node;
    RSS(ref_geom_add_with_descr(ref_geom, descr, &(b_real[2 * geom])),
        "geom add");
  }

  free(a_next);
  free(b_real);
  free(b_int);
  free(a_real);
  free(a_int);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}